

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall QByteArray::setRawData(QByteArray *this,char *data,qsizetype size)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (data == (char *)0x0 || size == 0) {
    QArrayDataPointer<char>::clear(&this->d);
  }
  else {
    fromRawData((QByteArray *)&local_38,data,size);
    pDVar2 = (this->d).d;
    pcVar3 = (this->d).ptr;
    (this->d).d = local_38.d;
    (this->d).ptr = local_38.ptr;
    qVar1 = (this->d).size;
    (this->d).size = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pcVar3;
    local_38.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::setRawData(const char *data, qsizetype size)
{
    if (!data || !size)
        clear();
    else
        *this = fromRawData(data, size);
    return *this;
}